

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t * ra_get_container(roaring_array_t *ra,uint16_t x,uint8_t *typecode)

{
  ushort uVar1;
  bool bVar2;
  uint in_ECX;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = ra->size + -1;
  uVar5 = 0;
  do {
    if (iVar3 < (int)uVar5) {
      uVar4 = ~uVar5;
      break;
    }
    uVar4 = uVar5 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)ra->keys + (ulong)(uVar5 + iVar3 & 0xfffffffe));
    if (uVar1 < x) {
      uVar5 = uVar4 + 1;
      bVar2 = true;
      uVar4 = in_ECX;
    }
    else if (x < uVar1) {
      iVar3 = uVar4 - 1;
      bVar2 = true;
      uVar4 = in_ECX;
    }
    else {
      bVar2 = false;
    }
    in_ECX = uVar4;
  } while (bVar2);
  if ((int)uVar4 < 0) {
    return (container_t *)0x0;
  }
  *typecode = ra->typecodes[uVar4];
  return ra->containers[uVar4];
}

Assistant:

container_t *ra_get_container(
    roaring_array_t *ra, uint16_t x, uint8_t *typecode
){
    int i = binarySearch(ra->keys, (int32_t)ra->size, x);
    if (i < 0) return NULL;
    *typecode = ra->typecodes[i];
    return ra->containers[i];
}